

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall amrex::EB2::Level::fillCentroid(Level *this,MultiFab *centroid,Geometry *geom)

{
  int dst_nghost;
  Periodicity local_30;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&centroid->super_FabArray<amrex::FArrayBox>,0.0);
  if (this->m_allregular == false) {
    dst_nghost = (centroid->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    local_30 = Geometry::periodicity(geom);
    FabArray<amrex::FArrayBox>::ParallelCopy
              (&centroid->super_FabArray<amrex::FArrayBox>,
               &(this->m_centroid).super_FabArray<amrex::FArrayBox>,0,0,3,0,dst_nghost,&local_30,
               COPY);
  }
  return;
}

Assistant:

void
Level::fillCentroid (MultiFab& centroid, const Geometry& geom) const
{
    centroid.setVal(0.0);
    if (!isAllRegular()) {
        centroid.ParallelCopy(m_centroid,0,0,AMREX_SPACEDIM,0,centroid.nGrow(),
                              geom.periodicity());
    }
}